

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

void CB_EXPLORE_ADF::output_example(vw *all,cb_explore_adf *c,multi_ex *ec_seq)

{
  polyprediction *a_s;
  int iVar1;
  action_score *paVar2;
  int *piVar3;
  wclass *pwVar4;
  wclass *pwVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  bool bVar8;
  pointer ppeVar9;
  ulong uVar10;
  ostream *poVar11;
  pointer ppeVar12;
  size_t i;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  size_t num_features;
  int *piVar16;
  float *pfVar17;
  float loss;
  float fVar18;
  undefined8 in_stack_fffffffffffffde8;
  vw *all_00;
  float fVar19;
  undefined4 uVar20;
  example *peVar21;
  example *ec;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  ppeVar12 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppeVar9 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar9 != ppeVar12) {
    peVar21 = *ppeVar12;
    a_s = &peVar21->pred;
    paVar2 = (peVar21->pred).a_s._begin;
    pfVar17 = (peVar21->pred).scalars._end;
    num_features = 0;
    for (uVar13 = 0; uVar20 = (undefined4)((ulong)c >> 0x20),
        uVar10 = (long)ppeVar9 - (long)ppeVar12 >> 3, uVar13 < uVar10; uVar13 = uVar13 + 1) {
      bVar8 = CB::ec_is_example_header(ppeVar12[uVar13]);
      ppeVar12 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      if (!bVar8) {
        num_features = num_features + ppeVar12[uVar13]->num_features;
      }
      ppeVar9 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    }
    fVar19 = (c->gen_cs).known_cost.probability;
    loss = 0.0;
    bVar8 = 0.0 < fVar19;
    if (0.0 < fVar19) {
      for (uVar15 = 0; uVar13 = (ulong)uVar15, uVar13 < (ulong)((long)pfVar17 - (long)paVar2 >> 3);
          uVar15 = uVar15 + 1) {
        fVar18 = (c->gen_cs).known_cost.cost / fVar19;
        if ((c->gen_cs).known_cost.action != paVar2[uVar13].action) {
          fVar18 = 0.0;
        }
        loss = loss + fVar18 * paVar2[uVar13].score;
      }
    }
    for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
      bVar8 = (bool)(bVar8 & ppeVar12[uVar13]->test_only);
    }
    all_00 = all;
    ec = peVar21;
    shared_data::update(all->sd,bVar8,0.0 < fVar19,loss,peVar21->weight,num_features);
    piVar3 = (all->final_prediction_sink)._end;
    for (piVar16 = (all->final_prediction_sink)._begin; piVar16 != piVar3; piVar16 = piVar16 + 1) {
      ACTION_SCORE::print_action_score
                (*piVar16,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,&peVar21->tag);
    }
    if (0 < all_00->raw_prediction) {
      outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
      outputString._M_string_length = 0;
      outputString.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
      pwVar4 = (ec->l).cs.costs._begin;
      pwVar5 = (ec->l).cs.costs._end;
      pfVar17 = &pwVar4->wap_value;
      for (lVar14 = 0; (long)pwVar5 - (long)pwVar4 >> 4 != lVar14; lVar14 = lVar14 + 1) {
        if (lVar14 != 0) {
          std::operator<<(&local_1a8,' ');
        }
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        poVar11 = std::operator<<(poVar11,':');
        std::ostream::operator<<(poVar11,*pfVar17);
        pfVar17 = pfVar17 + 4;
      }
      p_Var6 = all_00->print_text;
      iVar1 = all_00->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar7._end = (char *)all_00;
      vVar7._begin = (char *)in_stack_fffffffffffffde8;
      vVar7.end_array._0_4_ = fVar19;
      vVar7.end_array._4_4_ = uVar20;
      vVar7.erase_count = (size_t)ec;
      (*p_Var6)(iVar1,(string)peVar21->tag,vVar7);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
      std::__cxx11::string::~string((string *)&outputString);
    }
    CB::print_update(all_00,fVar19 <= 0.0,ec,ec_seq,true);
  }
  return;
}

Assistant:

void output_example(vw& all, cb_explore_adf& c, multi_ex& ec_seq)
{
  if (ec_seq.size() <= 0)
    return;

  size_t num_features = 0;

  float loss = 0.;

  auto& ec = *ec_seq[0];
  ACTION_SCORE::action_scores preds = ec.pred.a_s;

  for (size_t i = 0; i < ec_seq.size(); i++)
    if (!CB::ec_is_example_header(*ec_seq[i]))
      num_features += ec_seq[i]->num_features;

  bool labeled_example = true;
  if (c.gen_cs.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.gen_cs.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq.size(); i++) holdout_example &= ec_seq[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, &ec_seq, true);
}